

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_primitives.cpp
# Opt level: O0

spv_result_t spvtools::val::PrimitivesPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  uint32_t id;
  int32_t iVar2;
  Function *pFVar3;
  char *__s;
  DiagnosticStream *pDVar4;
  char *local_440;
  DiagnosticStream local_438;
  Op local_25c;
  char *pcStack_258;
  Op stream_opcode;
  DiagnosticStream local_250;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t stream_type;
  uint32_t stream_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Op local_24;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  this = inst_local;
  if (local_24 - OpEmitVertex < 4) {
    pFVar3 = Instruction::function(pIStack_20);
    id = Function::id(pFVar3);
    pFVar3 = ValidationState_t::function((ValidationState_t *)this,id);
    __s = spvOpcodeString(local_24);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stream_id,__s,(allocator<char> *)((long)&stream_type + 3));
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream_id,
                   " instructions require Geometry execution model");
    Function::RegisterExecutionModelLimitation(pFVar3,ExecutionModelGeometry,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&stream_id);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_type + 3));
  }
  if (local_24 == OpEmitStreamVertex || local_24 == OpEndStreamPrimitive) {
    local_70 = Instruction::word(pIStack_20,1);
    local_74 = ValidationState_t::GetTypeId((ValidationState_t *)inst_local,local_70);
    bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_74);
    if (!bVar1) {
      ValidationState_t::diag
                (&local_250,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      pcStack_258 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_250,&stack0xfffffffffffffda8);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [35])": expected Stream to be int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_250);
      return __local._4_4_;
    }
    local_25c = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_70);
    iVar2 = spvOpcodeIsConstant(local_25c);
    if (iVar2 == 0) {
      ValidationState_t::diag
                (&local_438,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      local_440 = spvOpcodeString(local_24);
      pDVar4 = DiagnosticStream::operator<<(&local_438,&local_440);
      pDVar4 = DiagnosticStream::operator<<
                         (pDVar4,(char (*) [45])": expected Stream to be constant instruction");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_438);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t PrimitivesPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (opcode) {
    case spv::Op::OpEmitVertex:
    case spv::Op::OpEndPrimitive:
    case spv::Op::OpEmitStreamVertex:
    case spv::Op::OpEndStreamPrimitive:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Geometry,
              std::string(spvOpcodeString(opcode)) +
                  " instructions require Geometry execution model");
      break;
    default:
      break;
  }

  switch (opcode) {
    case spv::Op::OpEmitStreamVertex:
    case spv::Op::OpEndStreamPrimitive: {
      const uint32_t stream_id = inst->word(1);
      const uint32_t stream_type = _.GetTypeId(stream_id);
      if (!_.IsIntScalarType(stream_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Stream to be int scalar";
      }

      const spv::Op stream_opcode = _.GetIdOpcode(stream_id);
      if (!spvOpcodeIsConstant(stream_opcode)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Stream to be constant instruction";
      }
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}